

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RenX_Warn.cpp
# Opt level: O0

void __thiscall
WarnGameCommand::trigger
          (WarnGameCommand *this,Server *source,PlayerInfo *player,string_view parameters)

{
  string_view in_key;
  bool bVar1;
  int iVar2;
  long lVar3;
  string *psVar4;
  Config *this_00;
  size_type sVar5;
  char *pcVar6;
  undefined8 uVar7;
  char *pcVar8;
  size_type sVar9;
  const_pointer pvVar10;
  basic_string_view<char,_std::char_traits<char>_> *in_whitespace;
  basic_string_view<char,_std::char_traits<char>_> bVar11;
  undefined8 in_stack_fffffffffffffc98;
  undefined4 uVar12;
  size_t local_268;
  char *local_260;
  string local_258;
  __sv_type local_238;
  string local_228;
  __sv_type local_208;
  string local_1f8;
  string_view local_1d8;
  __sv_type local_1c8;
  string local_1b8;
  __sv_type local_198;
  undefined8 local_188;
  string local_180;
  __sv_type local_160;
  basic_string_view<char,_std::char_traits<char>_> local_150;
  string local_140;
  __sv_type local_120;
  string local_100;
  __sv_type local_e0;
  size_t local_d0;
  char *local_c8;
  __sv_type local_c0;
  uint local_ac;
  char *pcStack_a8;
  int warns;
  size_t local_a0;
  long local_98;
  PlayerInfo *target;
  string_view reason;
  string_view name;
  basic_string_view<char,_std::char_traits<char>_> *local_60;
  char *local_58;
  undefined1 local_50 [8];
  pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>
  parameters_split;
  PlayerInfo *player_local;
  Server *source_local;
  WarnGameCommand *this_local;
  string_view parameters_local;
  
  uVar12 = (undefined4)((ulong)in_stack_fffffffffffffc98 >> 0x20);
  local_58 = parameters._M_str;
  in_whitespace = (basic_string_view<char,_std::char_traits<char>_> *)parameters._M_len;
  local_60 = in_whitespace;
  parameters_split.second._M_str = (char *)player;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            ((basic_string_view<char,_std::char_traits<char>_> *)&name._M_str," \t");
  jessilib::
  word_split_once_view<,std::basic_string_view<char,std::char_traits<char>>,std::basic_string_view<char,std::char_traits<char>>>
            ((pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>
              *)local_50,(jessilib *)&local_60,
             (basic_string_view<char,_std::char_traits<char>_> *)&name._M_str,in_whitespace);
  bVar1 = std::basic_string_view<char,_std::char_traits<char>_>::empty
                    ((basic_string_view<char,_std::char_traits<char>_> *)
                     &parameters_split.first._M_str);
  pcVar8 = parameters_split.second._M_str;
  if (bVar1) {
    bVar11 = sv("Error: Too few parameters. Syntax: Warn <Player> <Reason>",0x39);
    local_268 = bVar11._M_len;
    local_260 = bVar11._M_str;
    RenX::Server::sendMessage(source,pcVar8,local_268,local_260);
  }
  else {
    reason._M_str = (char *)local_50;
    name._M_len = parameters_split.first._M_len;
    target = (PlayerInfo *)parameters_split.first._M_str;
    reason._M_len = parameters_split.second._M_len;
    pcStack_a8 = (char *)local_50;
    local_a0 = parameters_split.first._M_len;
    local_98 = RenX::Server::getPlayerByPartName(source,local_50,parameters_split.first._M_len);
    if (local_98 != 0) {
      lVar3 = local_98 + 0x1b8;
      psVar4 = (string *)Jupiter::Plugin::getName_abi_cxx11_();
      local_c0 = std::__cxx11::string::operator_cast_to_basic_string_view(psVar4);
      this_00 = (Config *)Jupiter::Config::operator[](lVar3,local_c0._M_len,local_c0._M_str);
      local_d0 = 1;
      local_c8 = "w";
      in_key._M_str = "w";
      in_key._M_len = 1;
      iVar2 = Jupiter::Config::get<int>(this_00,in_key,0);
      lVar3 = local_98;
      local_ac = iVar2 + 1;
      if (pluginInstance.m_maxWarns < (int)local_ac) {
        if (pluginInstance.m_warnAction == -1) {
          string_printf_abi_cxx11_(&local_100,"Warning limit reached (%d warnings)",(ulong)local_ac)
          ;
          local_e0 = std::__cxx11::string::operator_cast_to_basic_string_view((string *)&local_100);
          RenX::Server::kickPlayer(source,lVar3,local_e0._M_len,local_e0._M_str);
          std::__cxx11::string::~string((string *)&local_100);
          pcVar8 = parameters_split.second._M_str;
          sVar5 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                  size((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       (local_98 + 8));
          pcVar6 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                   data((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        (local_98 + 8));
          string_printf_abi_cxx11_
                    (&local_140,
                     "%.*s has been kicked from the server for exceeding the warning limit (%d warnings)."
                     ,sVar5,pcVar6,(ulong)local_ac);
          local_120 = std::__cxx11::string::operator_cast_to_basic_string_view((string *)&local_140)
          ;
          RenX::Server::sendMessage(source,pcVar8,local_120._M_len,local_120._M_str);
          std::__cxx11::string::~string((string *)&local_140);
        }
        else {
          local_150 = sv("Jupiter Bot/RenX.Warn",0x15);
          string_printf_abi_cxx11_(&local_180,"Warning limit reached (%d warnings)",(ulong)local_ac)
          ;
          local_160 = std::__cxx11::string::operator_cast_to_basic_string_view((string *)&local_180)
          ;
          std::chrono::duration<long,std::ratio<1l,1l>>::duration<int,void>
                    ((duration<long,std::ratio<1l,1l>> *)&local_188,&pluginInstance.m_warnAction);
          RenX::Server::banPlayer
                    (source,lVar3,local_150._M_len,local_150._M_str,local_160._M_len,
                     local_160._M_str,local_188);
          std::__cxx11::string::~string((string *)&local_180);
          pcVar8 = parameters_split.second._M_str;
          sVar5 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                  size((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       (local_98 + 8));
          pcVar6 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                   data((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        (local_98 + 8));
          string_printf_abi_cxx11_
                    (&local_1b8,
                     "%.*s has been banned from the server for exceeding the warning limit (%d warnings)."
                     ,sVar5,pcVar6,(ulong)local_ac);
          local_198 = std::__cxx11::string::operator_cast_to_basic_string_view((string *)&local_1b8)
          ;
          RenX::Server::sendMessage(source,pcVar8,local_198._M_len,local_198._M_str);
          std::__cxx11::string::~string((string *)&local_1b8);
        }
      }
      else {
        lVar3 = local_98 + 0x1b8;
        psVar4 = (string *)Jupiter::Plugin::getName_abi_cxx11_();
        local_1c8 = std::__cxx11::string::operator_cast_to_basic_string_view(psVar4);
        uVar7 = Jupiter::Config::operator[](lVar3,local_1c8._M_len,local_1c8._M_str);
        local_1d8 = WARNS_KEY;
        std::__cxx11::to_string(&local_1f8,local_ac);
        Jupiter::Config::set(uVar7,local_1d8._M_len,local_1d8._M_str,&local_1f8);
        std::__cxx11::string::~string((string *)&local_1f8);
        lVar3 = local_98;
        sVar5 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                size((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     (parameters_split.second._M_str + 8));
        pcVar8 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                 data((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                      (parameters_split.second._M_str + 8));
        sVar9 = std::basic_string_view<char,_std::char_traits<char>_>::size
                          ((basic_string_view<char,_std::char_traits<char>_> *)&target);
        pvVar10 = std::basic_string_view<char,_std::char_traits<char>_>::data
                            ((basic_string_view<char,_std::char_traits<char>_> *)&target);
        string_printf_abi_cxx11_
                  (&local_228,"You have been warned by %.*s for: %.*s. You have %d warnings.",sVar5,
                   pcVar8,sVar9,pvVar10,CONCAT44(uVar12,local_ac));
        local_208 = std::__cxx11::string::operator_cast_to_basic_string_view((string *)&local_228);
        RenX::Server::sendWarnMessage(source,lVar3,local_208._M_len,local_208._M_str);
        std::__cxx11::string::~string((string *)&local_228);
        pcVar8 = parameters_split.second._M_str;
        sVar5 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                size((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     (local_98 + 8));
        pcVar6 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                 data((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                      (local_98 + 8));
        string_printf_abi_cxx11_
                  (&local_258,"%.*s has been warned; they now have %d warnings.",sVar5,pcVar6,
                   (ulong)local_ac);
        local_238 = std::__cxx11::string::operator_cast_to_basic_string_view((string *)&local_258);
        RenX::Server::sendMessage(source,pcVar8,local_238._M_len,local_238._M_str);
        std::__cxx11::string::~string((string *)&local_258);
      }
    }
  }
  return;
}

Assistant:

void WarnGameCommand::trigger(RenX::Server *source, RenX::PlayerInfo *player, std::string_view parameters) {
	auto parameters_split = jessilib::word_split_once_view(std::string_view{parameters}, WHITESPACE_SV);
	if (!parameters_split.second.empty()) {
		std::string_view name = parameters_split.first;
		std::string_view reason = parameters_split.second;

		RenX::PlayerInfo *target = source->getPlayerByPartName(name);
		if (target != nullptr) {
			int warns = target->varData[pluginInstance.getName()].get<int>(WARNS_KEY) + 1;
			if (warns > pluginInstance.m_maxWarns) {
				switch (pluginInstance.m_warnAction)
				{
				case -1:
					source->kickPlayer(*target, string_printf("Warning limit reached (%d warnings)", warns));
					source->sendMessage(*player, string_printf("%.*s has been kicked from the server for exceeding the warning limit (%d warnings).", target->name.size(), target->name.data(), warns));
					break;
				default:
					source->banPlayer(*target, "Jupiter Bot/RenX.Warn"sv, string_printf("Warning limit reached (%d warnings)", warns), std::chrono::seconds(pluginInstance.m_warnAction));
					source->sendMessage(*player, string_printf("%.*s has been banned from the server for exceeding the warning limit (%d warnings).", target->name.size(), target->name.data(), warns));
					break;
				}
			}
			else {
				target->varData[pluginInstance.getName()].set(WARNS_KEY, std::to_string(warns));
				source->sendWarnMessage(*target, string_printf("You have been warned by %.*s for: %.*s. You have %d warnings.", player->name.size(), player->name.data(), reason.size(), reason.data(), warns));
				source->sendMessage(*player, string_printf("%.*s has been warned; they now have %d warnings.", target->name.size(), target->name.data(), warns));
			}
		}
	}
	else
		source->sendMessage(*player, "Error: Too few parameters. Syntax: Warn <Player> <Reason>"sv);
}